

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Client * __thiscall
capnp::_::anon_unknown_0::TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
          (Client *__return_storage_ptr__,Vat *this,StringPtr to,bool unique)

{
  StructDataBitCount *this_00;
  Reader vatId;
  Reader local_1a8;
  Client local_178;
  ArrayPtr<const_char> local_168 [2];
  undefined1 local_148 [8];
  Builder hostId;
  MallocMessageBuilder refMessage;
  bool unique_local;
  Vat *this_local;
  StringPtr to_local;
  
  to_local.content.ptr = (char *)to.content.size_;
  this_local = (Vat *)to.content.ptr;
  this_00 = &hostId._builder.dataSize;
  to_local.content.size_ = (size_t)__return_storage_ptr__;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x80,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestSturdyRefHostId>
            ((Builder *)local_148,(MessageBuilder *)this_00);
  Text::Reader::Reader((Reader *)local_168,(StringPtr *)&this_local);
  capnproto_test::capnp::test::TestSturdyRefHostId::Builder::setHost
            ((Builder *)local_148,(Reader)local_168[0]);
  capnproto_test::capnp::test::TestSturdyRefHostId::Builder::setUnique((Builder *)local_148,unique);
  capnproto_test::capnp::test::TestSturdyRefHostId::Builder::operator_cast_to_Reader
            (&local_1a8,(Builder *)local_148);
  vatId._reader.capTable = local_1a8._reader.capTable;
  vatId._reader.segment = local_1a8._reader.segment;
  vatId._reader.data = local_1a8._reader.data;
  vatId._reader.pointers = local_1a8._reader.pointers;
  vatId._reader.dataSize = local_1a8._reader.dataSize;
  vatId._reader.pointerCount = local_1a8._reader.pointerCount;
  vatId._reader._38_2_ = local_1a8._reader._38_2_;
  vatId._reader.nestingLimit = local_1a8._reader.nestingLimit;
  vatId._reader._44_4_ = local_1a8._reader._44_4_;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::bootstrap
            ((RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *)&local_178,vatId);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
            (__return_storage_ptr__,&local_178);
  Capability::Client::~Client(&local_178);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&hostId._builder.dataSize);
  return __return_storage_ptr__;
}

Assistant:

typename T::Client connect(kj::StringPtr to, bool unique = false) {
      MallocMessageBuilder refMessage(128);
      auto hostId = refMessage.initRoot<test::TestSturdyRefHostId>();
      hostId.setHost(to);
      hostId.setUnique(unique);
      return rpcSystem.bootstrap(hostId).castAs<T>();
    }